

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetBlue
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  blue local_9;
  
  if (this->color_ == true) {
    local_9.isPrint = this->print_;
    pcVar1 = clr::blue::operator_cast_to_char_(&local_9);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetBlue(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::blue{print_};
}